

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

string * __thiscall
google::protobuf::Reflection::GetRepeatedString_abi_cxx11_
          (string *__return_storage_ptr__,Reflection *this,Message *message,FieldDescriptor *field,
          int index)

{
  pointer pcVar1;
  string *psVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  FieldDescriptor *local_38;
  _func_void_FieldDescriptor_ptr *local_30;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetRepeatedString",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_30 = FieldDescriptor::TypeOnceInit;
    local_38 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_30,&local_38);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetRepeatedString",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    psVar2 = internal::ExtensionSet::GetRepeatedString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        index);
  }
  else {
    pRVar3 = GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(this,message,field);
    psVar2 = (string *)((pRVar3->super_RepeatedPtrFieldBase).rep_)->elements[index];
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Reflection::GetRepeatedString(const Message& message,
                                          const FieldDescriptor* field,
                                          int index) const {
  USAGE_CHECK_ALL(GetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetRepeatedString(field->number(), index);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        return GetRepeatedPtrField<std::string>(message, field, index);
    }
  }
}